

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fphdlimp.cpp
# Opt level: O2

void __thiscall
icu_63::FieldPositionIteratorHandler::addAttribute
          (FieldPositionIteratorHandler *this,int32_t id,int32_t start,int32_t limit)

{
  UErrorCode *status;
  int32_t newSize;
  
  if (((this->iter != (FieldPositionIterator *)0x0) && (start < limit)) &&
     (this->status < U_ILLEGAL_ARGUMENT_ERROR)) {
    status = &this->status;
    newSize = this->vec->count;
    UVector32::addElement(this->vec,id,status);
    UVector32::addElement(this->vec,start + (this->super_FieldPositionHandler).fShift,status);
    UVector32::addElement(this->vec,limit + (this->super_FieldPositionHandler).fShift,status);
    if (U_ZERO_ERROR < this->status) {
      UVector32::setSize(this->vec,newSize);
      return;
    }
  }
  return;
}

Assistant:

void
FieldPositionIteratorHandler::addAttribute(int32_t id, int32_t start, int32_t limit) {
  if (iter && U_SUCCESS(status) && start < limit) {
    int32_t size = vec->size();
    vec->addElement(id, status);
    vec->addElement(start + fShift, status);
    vec->addElement(limit + fShift, status);
    if (!U_SUCCESS(status)) {
      vec->setSize(size);
    }
  }
}